

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

void __thiscall
pugi::impl::anon_unknown_0::xml_buffered_writer::flush
          (xml_buffered_writer *this,char_t *data,size_t size)

{
  byte *pbVar1;
  byte *pbVar2;
  anon_union_8192_4_fbc60714_for_scratch *paVar3;
  byte bVar4;
  xml_encoding xVar5;
  _func_int *UNRECOVERED_JUMPTABLE;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  anon_union_8192_4_fbc60714_for_scratch *paVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  byte bVar14;
  uint uVar15;
  value_type i;
  ushort uVar16;
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  
  if (size == 0) {
    return;
  }
  xVar5 = this->encoding;
  if (xVar5 == encoding_utf8) {
    (*this->writer->_vptr_xml_writer[2])();
    return;
  }
  paVar3 = &this->scratch;
  if ((xVar5 & ~encoding_utf8) == encoding_utf16_le) {
    lVar10 = 0x800;
    do {
      bVar4 = (byte)*(uint *)data;
      if ((char)bVar4 < '\0') {
        uVar13 = (uint)bVar4;
        if (((size == 1) || ((uVar13 & 0xffffffe0) != 0xc0)) ||
           (pbVar1 = (byte *)((long)data + 1), (*pbVar1 & 0xc0) != 0x80)) {
          if ((((size < 3) || ((uVar13 & 0xfffffff0) != 0xe0)) ||
              (pbVar1 = (byte *)((long)data + 1), (*pbVar1 & 0xffc0) != 0x80)) ||
             (pbVar2 = (byte *)((long)data + 2), (*pbVar2 & 0xc0) != 0x80)) {
            if (((size < 4) || ((uVar13 & 0xfffffff8) != 0xf0)) ||
               ((pbVar1 = (byte *)((long)data + 1), (*pbVar1 & 0xffffffc0) != 0x80 ||
                (((*(byte *)((long)data + 2) & 0xc0) != 0x80 ||
                 (bVar4 = *(byte *)((long)data + 3), (bVar4 & 0xc0) != 0x80)))))) {
              data = (char_t *)((long)data + 1);
              size = size - 1;
            }
            else {
              uVar15 = (uint)*(byte *)((long)data + 2) << 6;
              data = (char_t *)((long)data + 4);
              size = size - 4;
              *(short *)(this->buffer + lVar10) =
                   (short)((uVar15 & 0xc00) + 0x3ff0000 +
                           ((*pbVar1 & 0x3f) << 0xc | (uVar13 & 7) << 0x12) >> 10) + -0x2800;
              *(ushort *)(this->buffer + lVar10 + 2) =
                   bVar4 & 0x3f | (ushort)uVar15 & 0x3ff | 0xdc00;
              lVar10 = lVar10 + 4;
            }
            goto LAB_0011203b;
          }
          data = (char_t *)((long)data + 3);
          size = size - 3;
          *(ushort *)(this->buffer + lVar10) =
               *pbVar2 & 0x3f | (*pbVar1 & 0x3f) << 6 | (ushort)bVar4 << 0xc;
        }
        else {
          data = (char_t *)((long)data + 2);
          size = size - 2;
          *(ushort *)(this->buffer + lVar10) = *pbVar1 & 0x3f | (ushort)((uVar13 & 0x1f) << 6);
        }
        lVar10 = lVar10 + 2;
      }
      else {
        *(ushort *)(this->buffer + lVar10) = (ushort)bVar4;
        lVar10 = lVar10 + 2;
        data = (char_t *)((long)data + 1);
        size = size - 1;
        if ((3 < size) && (((ulong)data & 3) == 0)) {
          do {
            if ((*(uint *)data & 0x80808080) != 0) break;
            size = size - 4;
            *(ushort *)(this->buffer + lVar10) = (ushort)*(uint *)data & 0x7f;
            *(ushort *)(this->buffer + lVar10 + 2) = (ushort)*(byte *)((long)data + 1);
            *(ushort *)(this->buffer + lVar10 + 4) = (ushort)*(byte *)((long)data + 2);
            pbVar1 = (byte *)((long)data + 3);
            data = (char_t *)((long)data + 4);
            *(ushort *)(this->buffer + lVar10 + 6) = (ushort)*pbVar1;
            lVar10 = lVar10 + 8;
          } while (3 < size);
        }
      }
LAB_0011203b:
    } while (size != 0);
    paVar9 = (anon_union_8192_4_fbc60714_for_scratch *)(this->buffer + lVar10);
    if (lVar10 != 0x800 && xVar5 != encoding_utf16_le) {
      auVar17 = vpmovsxbq_avx512f(ZEXT816(0x1f1e1d1c1b1a1918));
      auVar18 = vpmovsxbq_avx512f(ZEXT816(0x1716151413121110));
      auVar19 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar20 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar21 = vbroadcasti32x4_avx512f(_DAT_00118ba0);
      lVar11 = 0;
      auVar22 = vpbroadcastq_avx512f();
      auVar22 = vpsrlq_avx512f(auVar22,1);
      do {
        auVar23 = vpbroadcastq_avx512f();
        auVar24 = vporq_avx512f(auVar23,auVar17);
        auVar25 = vporq_avx512f(auVar23,auVar19);
        auVar26 = vporq_avx512f(auVar23,auVar18);
        auVar23 = vporq_avx512f(auVar23,auVar20);
        uVar6 = vpcmpuq_avx512f(auVar23,auVar22,2);
        uVar7 = vpcmpuq_avx512f(auVar25,auVar22,2);
        uVar8 = vpcmpuq_avx512f(auVar24,auVar22,2);
        bVar4 = (byte)uVar8;
        uVar8 = vpcmpuq_avx512f(auVar26,auVar22,2);
        uVar16 = CONCAT11(bVar4,(byte)uVar8);
        uVar13 = CONCAT22(uVar16,CONCAT11((byte)uVar7,(byte)uVar6));
        auVar23 = vmovdqu16_avx512bw(*(undefined1 (*) [64])((long)paVar3 + lVar11 * 2));
        auVar24._2_2_ = (ushort)((byte)(uVar13 >> 1) & 1) * auVar23._2_2_;
        auVar24._0_2_ = (ushort)((byte)uVar6 & 1) * auVar23._0_2_;
        auVar24._4_2_ = (ushort)((byte)(uVar13 >> 2) & 1) * auVar23._4_2_;
        auVar24._6_2_ = (ushort)((byte)(uVar13 >> 3) & 1) * auVar23._6_2_;
        auVar24._8_2_ = (ushort)((byte)(uVar13 >> 4) & 1) * auVar23._8_2_;
        auVar24._10_2_ = (ushort)((byte)(uVar13 >> 5) & 1) * auVar23._10_2_;
        auVar24._12_2_ = (ushort)((byte)(uVar13 >> 6) & 1) * auVar23._12_2_;
        auVar24._14_2_ = (ushort)((byte)(uVar13 >> 7) & 1) * auVar23._14_2_;
        auVar24._16_2_ = (ushort)((byte)uVar7 & 1) * auVar23._16_2_;
        auVar24._18_2_ = (ushort)((byte)(uVar13 >> 9) & 1) * auVar23._18_2_;
        auVar24._20_2_ = (ushort)((byte)(uVar13 >> 10) & 1) * auVar23._20_2_;
        auVar24._22_2_ = (ushort)((byte)(uVar13 >> 0xb) & 1) * auVar23._22_2_;
        auVar24._24_2_ = (ushort)((byte)(uVar13 >> 0xc) & 1) * auVar23._24_2_;
        auVar24._26_2_ = (ushort)((byte)(uVar13 >> 0xd) & 1) * auVar23._26_2_;
        auVar24._28_2_ = (ushort)((byte)(uVar13 >> 0xe) & 1) * auVar23._28_2_;
        auVar24._30_2_ = (ushort)((byte)(uVar13 >> 0xf) & 1) * auVar23._30_2_;
        auVar24._32_2_ = (ushort)((byte)uVar8 & 1) * auVar23._32_2_;
        auVar24._34_2_ = (ushort)((byte)(uVar16 >> 1) & 1) * auVar23._34_2_;
        auVar24._36_2_ = (ushort)((byte)(uVar16 >> 2) & 1) * auVar23._36_2_;
        auVar24._38_2_ = (ushort)((byte)(uVar16 >> 3) & 1) * auVar23._38_2_;
        auVar24._40_2_ = (ushort)((byte)(uVar16 >> 4) & 1) * auVar23._40_2_;
        auVar24._42_2_ = (ushort)((byte)(uVar16 >> 5) & 1) * auVar23._42_2_;
        auVar24._44_2_ = (ushort)((byte)(uVar16 >> 6) & 1) * auVar23._44_2_;
        auVar24._46_2_ = (ushort)((byte)(uVar16 >> 7) & 1) * auVar23._46_2_;
        auVar24._48_2_ = (ushort)(bVar4 & 1) * auVar23._48_2_;
        auVar24._50_2_ = (ushort)(bVar4 >> 1 & 1) * auVar23._50_2_;
        auVar24._52_2_ = (ushort)(bVar4 >> 2 & 1) * auVar23._52_2_;
        auVar24._54_2_ = (ushort)(bVar4 >> 3 & 1) * auVar23._54_2_;
        auVar24._56_2_ = (ushort)(bVar4 >> 4 & 1) * auVar23._56_2_;
        auVar24._58_2_ = (ushort)(bVar4 >> 5 & 1) * auVar23._58_2_;
        auVar24._60_2_ = (ushort)(bVar4 >> 6 & 1) * auVar23._60_2_;
        auVar24._62_2_ = (ushort)(bVar4 >> 7) * auVar23._62_2_;
        auVar23 = vpshufb_avx512bw(auVar24,auVar21);
        auVar23 = vmovdqu16_avx512bw(auVar23);
        *(undefined1 (*) [64])((long)paVar3 + lVar11 * 2) = auVar23;
        lVar11 = lVar11 + 0x20;
      } while ((lVar10 - 0x802U >> 1 & 0xffffffffffffffe0) + 0x20 != lVar11);
    }
  }
  else if (xVar5 - encoding_utf32_le < 2) {
    paVar9 = (anon_union_8192_4_fbc60714_for_scratch *)
             utf8_decoder::process<pugi::impl::(anonymous_namespace)::utf32_writer>
                       (data,size,paVar3);
    if (paVar9 != paVar3 && xVar5 != encoding_utf32_le) {
      auVar17 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar18 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar19 = vbroadcasti32x4_avx512f(_DAT_00118b90);
      auVar20 = vpbroadcastq_avx512f();
      auVar20 = vpsrlq_avx512f(auVar20,2);
      uVar12 = 0;
      do {
        auVar21 = vpbroadcastq_avx512f();
        auVar22 = vporq_avx512f(auVar21,auVar17);
        auVar21 = vporq_avx512f(auVar21,auVar18);
        uVar6 = vpcmpuq_avx512f(auVar21,auVar20,2);
        uVar7 = vpcmpuq_avx512f(auVar22,auVar20,2);
        bVar4 = (byte)uVar7;
        uVar16 = CONCAT11(bVar4,(byte)uVar6);
        auVar22 = vmovdqu32_avx512f(*(undefined1 (*) [64])((long)paVar3 + uVar12 * 4));
        auVar21._4_4_ = (uint)((byte)(uVar16 >> 1) & 1) * auVar22._4_4_;
        auVar21._0_4_ = (uint)((byte)uVar6 & 1) * auVar22._0_4_;
        auVar21._8_4_ = (uint)((byte)(uVar16 >> 2) & 1) * auVar22._8_4_;
        auVar21._12_4_ = (uint)((byte)(uVar16 >> 3) & 1) * auVar22._12_4_;
        auVar21._16_4_ = (uint)((byte)(uVar16 >> 4) & 1) * auVar22._16_4_;
        auVar21._20_4_ = (uint)((byte)(uVar16 >> 5) & 1) * auVar22._20_4_;
        auVar21._24_4_ = (uint)((byte)(uVar16 >> 6) & 1) * auVar22._24_4_;
        auVar21._28_4_ = (uint)((byte)(uVar16 >> 7) & 1) * auVar22._28_4_;
        auVar21._32_4_ = (uint)(bVar4 & 1) * auVar22._32_4_;
        auVar21._36_4_ = (uint)(bVar4 >> 1 & 1) * auVar22._36_4_;
        auVar21._40_4_ = (uint)(bVar4 >> 2 & 1) * auVar22._40_4_;
        auVar21._44_4_ = (uint)(bVar4 >> 3 & 1) * auVar22._44_4_;
        auVar21._48_4_ = (uint)(bVar4 >> 4 & 1) * auVar22._48_4_;
        auVar21._52_4_ = (uint)(bVar4 >> 5 & 1) * auVar22._52_4_;
        auVar21._56_4_ = (uint)(bVar4 >> 6 & 1) * auVar22._56_4_;
        auVar21._60_4_ = (uint)(bVar4 >> 7) * auVar22._60_4_;
        auVar21 = vpshufb_avx512bw(auVar21,auVar19);
        auVar21 = vmovdqu32_avx512f(auVar21);
        *(undefined1 (*) [64])((long)paVar3 + uVar12 * 4) = auVar21;
        uVar12 = uVar12 + 0x10;
      } while ((((ulong)((long)paVar9 + (-0x804 - (long)this)) >> 2) + 0x10 & 0x7ffffffffffffff0) !=
               uVar12);
    }
  }
  else {
    paVar9 = paVar3;
    if (xVar5 != encoding_latin1) {
      __assert_fail("false && \"Invalid encoding\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                    ,0xe67,
                    "size_t pugi::impl::(anonymous namespace)::convert_buffer_output(char_t *, uint8_t *, uint16_t *, uint32_t *, const char_t *, size_t, xml_encoding)"
                   );
    }
    do {
      bVar4 = (byte)*(uint *)data;
      if ((char)bVar4 < '\0') {
        if ((((size < 3) || ((bVar4 & 0xf0) != 0xe0)) ||
            ((*(byte *)((long)data + 1) & 0xc0) != 0x80)) ||
           ((*(byte *)((long)data + 2) & 0xc0) != 0x80)) {
          data = (char_t *)((long)data + 1);
          size = size - 1;
        }
        else {
          uVar13 = (uint)*(byte *)((long)data + 1) << 6;
          bVar14 = *(byte *)((long)data + 2) & 0x3f | (byte)uVar13;
          if ((uVar13 & 0xf00) != 0 || (bVar4 & 0xf) != 0) {
            bVar14 = 0x3f;
          }
          data = (char_t *)((long)data + 3);
          size = size - 3;
          paVar9->data_u8[0] = bVar14;
          paVar9 = (anon_union_8192_4_fbc60714_for_scratch *)((long)paVar9 + 1);
        }
      }
      else {
        paVar9->data_u8[0] = bVar4;
        paVar9 = (anon_union_8192_4_fbc60714_for_scratch *)(paVar9->data_u8 + 1);
        data = (char_t *)((long)data + 1);
        size = size - 1;
        if ((3 < size) && (((ulong)data & 3) == 0)) {
          do {
            if ((*(uint *)data & 0x80808080) != 0) break;
            paVar9->data_u8[0] = (byte)*(uint *)data;
            size = size - 4;
            paVar9->data_u8[1] = *(byte *)((long)data + 1);
            paVar9->data_u8[2] = *(byte *)((long)data + 2);
            pbVar1 = (byte *)((long)data + 3);
            data = (char_t *)((long)data + 4);
            paVar9->data_u8[3] = *pbVar1;
            paVar9 = (anon_union_8192_4_fbc60714_for_scratch *)(paVar9->data_u8 + 4);
          } while (3 < size);
        }
      }
    } while (size != 0);
  }
  if ((ulong)((long)paVar9 - (long)paVar3->data_u8) < 0x2001) {
    UNRECOVERED_JUMPTABLE = this->writer->_vptr_xml_writer[2];
    (*UNRECOVERED_JUMPTABLE)
              (this->writer,paVar3,(long)paVar9 - (long)paVar3->data_u8,UNRECOVERED_JUMPTABLE);
    return;
  }
  __assert_fail("result <= sizeof(scratch)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                ,0xe89,
                "void pugi::impl::(anonymous namespace)::xml_buffered_writer::flush(const char_t *, size_t)"
               );
}

Assistant:

void flush(const char_t* data, size_t size)
		{
			if (size == 0) return;

			// fast path, just write data
			if (encoding == get_write_native_encoding())
				writer.write(data, size * sizeof(char_t));
			else
			{
				// convert chunk
				size_t result = convert_buffer_output(scratch.data_char, scratch.data_u8, scratch.data_u16, scratch.data_u32, data, size, encoding);
				assert(result <= sizeof(scratch));

				// write data
				writer.write(scratch.data_u8, result);
			}
		}